

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_add_clienthello_tlsext
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_encoded,bool *out_needs_psk_binder,
               ssl_client_hello_type_t type,size_t header_len)

{
  SSL *pSVar1;
  SSL *pSVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  byte *pbVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  EVP_MD *md;
  undefined4 extraout_var;
  ulong uVar13;
  uint8_t *puVar14;
  ulong uVar15;
  byte bVar16;
  size_t sVar17;
  long lVar18;
  ulong local_180;
  CBB extensions;
  CBB extensions_1;
  ScopedCBB outer_extensions;
  CBB extensions_encoded;
  CBB local_90;
  CBB extension;
  
  *out_needs_psk_binder = false;
  if (type != ssl_client_hello_inner) {
    if (out_encoded != (CBB *)0x0) {
      __assert_fail("out_encoded == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xf22,
                    "bool bssl::ssl_add_clienthello_tlsext(SSL_HANDSHAKE *, CBB *, CBB *, bool *, ssl_client_hello_type_t, size_t)"
                   );
    }
    pSVar1 = hs->ssl;
    iVar7 = CBB_add_u16_length_prefixed(out,&extensions);
    if (iVar7 == 0) {
      iVar7 = 0xf26;
      goto LAB_0013659d;
    }
    (hs->extensions).sent = 0;
    if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
      uVar6 = ssl_get_grease_value(hs,ssl_grease_extension1);
      bVar3 = add_padding_extension(&extensions,uVar6,0);
      if (!bVar3) {
        return false;
      }
    }
    bVar3 = false;
    for (sVar17 = 0; sVar17 != 0x1c; sVar17 = sVar17 + 1) {
      sVar9 = sVar17;
      if ((hs->extension_permutation).size_ != 0) {
        pbVar8 = Array<unsigned_char>::operator[](&hs->extension_permutation,sVar17);
        sVar9 = (size_t)*pbVar8;
      }
      sVar10 = CBB_len(&extensions);
      cVar4 = (**(code **)(&UNK_002cf408 + sVar9 * 0x28))(hs,&extensions,&extensions,type);
      if (cVar4 == '\0') {
        ERR_put_error(0x10,0,0x93,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xf3d);
        ERR_add_error_dataf("extension %u",(ulong)(ushort)(&kExtensions)[sVar9 * 0x14]);
        return false;
      }
      sVar11 = CBB_len(&extensions);
      if (sVar11 != sVar10) {
        (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)sVar9 & 0x1f);
      }
      bVar3 = sVar11 - sVar10 == 4;
    }
    if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
      uVar6 = ssl_get_grease_value(hs,ssl_grease_extension2);
      bVar5 = add_padding_extension(&extensions,uVar6,1);
      bVar3 = false;
      if (!bVar5) {
        return false;
      }
    }
    pSVar2 = hs->ssl;
    bVar5 = should_offer_psk(hs,type);
    if (bVar5) {
      md = (EVP_MD *)
           ssl_session_get_digest
                     ((pSVar2->session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      iVar7 = EVP_MD_size(md);
      lVar18 = CONCAT44(extraout_var,iVar7) +
               *(size_t *)
                ((long)&((pSVar2->session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ticket + 8) +
               0xf;
    }
    else {
      lVar18 = 0;
    }
    iVar7 = SSL_is_dtls(pSVar1);
    if (((iVar7 == 0) && (iVar7 = SSL_is_quic(pSVar1), iVar7 == 0)) &&
       ((pSVar1->s3->field_0xdd & 0x10) == 0)) {
      sVar17 = CBB_len(&extensions);
      uVar15 = sVar17 + header_len + lVar18 + 6;
      bVar16 = bVar3 & lVar18 == 0;
      uVar13 = sVar17 + 0xb + header_len + lVar18;
      if (bVar16 == 0) {
        uVar13 = uVar15;
      }
      if ((uVar13 & 0xffffffffffffff00) == 0x100) {
        if (uVar15 < 0x1fc) {
          sVar17 = 0x1fc - uVar15;
          goto LAB_00136905;
        }
        sVar17 = 1;
      }
      else {
        sVar17 = (size_t)bVar16;
LAB_00136905:
        if (sVar17 == 0) goto LAB_00136924;
      }
      bVar3 = add_padding_extension(&extensions,0x15,sVar17);
      if (!bVar3) {
        return false;
      }
    }
LAB_00136924:
    sVar17 = CBB_len(&extensions);
    bVar3 = ext_pre_shared_key_add_clienthello(hs,&extensions,out_needs_psk_binder,type);
    if (bVar3) {
      sVar9 = CBB_len(&extensions);
      if (lVar18 == sVar9 - sVar17) {
        sVar17 = CBB_len(&extensions);
        if (sVar17 == 0) {
          CBB_discard_child(out);
        }
        iVar7 = CBB_flush(out);
        return iVar7 != 0;
      }
      __assert_fail("psk_extension_len == CBB_len(&extensions) - len_before",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xf8a,
                    "bool bssl::ssl_add_clienthello_tlsext(SSL_HANDSHAKE *, CBB *, CBB *, bool *, ssl_client_hello_type_t, size_t)"
                   );
    }
    iVar7 = 0xf87;
LAB_0013659d:
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,iVar7);
    return false;
  }
  pSVar1 = hs->ssl;
  CBB_zero(&extensions);
  CBB_zero(&outer_extensions.ctx_);
  iVar7 = CBB_add_u16_length_prefixed(out,&extensions_1);
  if (((iVar7 == 0) ||
      (iVar7 = CBB_add_u16_length_prefixed(out_encoded,&extensions_encoded), iVar7 == 0)) ||
     ((iVar7 = CBB_init(&extensions,0x40), iVar7 == 0 ||
      (iVar7 = CBB_init(&outer_extensions.ctx_,0x40), iVar7 == 0)))) {
    bVar3 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xeba);
    goto LAB_00136569;
  }
  hs->inner_extensions_sent = 0;
  if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) == 0) {
LAB_0013633a:
    for (sVar17 = 0; sVar17 != 0x1c; sVar17 = sVar17 + 1) {
      local_180 = sVar17;
      if ((hs->extension_permutation).size_ != 0) {
        pbVar8 = Array<unsigned_char>::operator[](&hs->extension_permutation,sVar17);
        local_180 = (ulong)*pbVar8;
      }
      sVar9 = CBB_len(&extensions_1);
      sVar10 = CBB_len(&extensions);
      cVar4 = (**(code **)(&UNK_002cf408 + local_180 * 0x28))(hs,&extensions_1,&extensions,1);
      if (cVar4 == '\0') {
        ERR_put_error(0x10,0,0x93,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xed2);
        bVar3 = false;
        ERR_add_error_dataf("extension %u",(ulong)(ushort)(&kExtensions)[local_180 * 0x14]);
        goto LAB_00136569;
      }
      sVar11 = CBB_len(&extensions_1);
      sVar12 = CBB_len(&extensions);
      if (sVar12 != sVar10 && sVar11 != sVar9) {
        __assert_fail("bytes_written == 0 || bytes_written_compressed == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xedb,
                      "bool bssl::ssl_add_clienthello_tlsext_inner(SSL_HANDSHAKE *, CBB *, CBB *, bool *)"
                     );
      }
      if (sVar12 != sVar10 || sVar11 != sVar9) {
        hs->inner_extensions_sent = hs->inner_extensions_sent | 1 << ((byte)local_180 & 0x1f);
      }
      if ((sVar12 != sVar10) &&
         (iVar7 = CBB_add_u16(&outer_extensions.ctx_,(&kExtensions)[local_180 * 0x14]), iVar7 == 0))
      goto LAB_001368c3;
    }
    if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
      uVar6 = ssl_get_grease_value(hs,ssl_grease_extension2);
      bVar3 = add_padding_extension(&extensions,uVar6,1);
      if ((!bVar3) || (iVar7 = CBB_add_u16(&outer_extensions.ctx_,uVar6), iVar7 == 0))
      goto LAB_001368c3;
    }
    puVar14 = CBB_data(&extensions_1);
    sVar17 = CBB_len(&extensions_1);
    iVar7 = CBB_add_bytes(&extensions_encoded,puVar14,sVar17);
    if (iVar7 != 0) {
      sVar17 = CBB_len(&extensions);
      if (sVar17 == 0) {
LAB_00136847:
        sVar17 = CBB_len(&extensions_1);
        bVar3 = ext_pre_shared_key_add_clienthello
                          (hs,&extensions_1,out_needs_psk_binder,ssl_client_hello_inner);
        if (bVar3) {
          puVar14 = CBB_data(&extensions_1);
          sVar9 = CBB_len(&extensions_1);
          iVar7 = CBB_add_bytes(&extensions_encoded,puVar14 + sVar17,sVar9 - sVar17);
          if ((iVar7 != 0) && (iVar7 = CBB_flush(out), iVar7 != 0)) {
            iVar7 = CBB_flush(out_encoded);
            bVar3 = iVar7 != 0;
            goto LAB_00136569;
          }
        }
      }
      else {
        puVar14 = CBB_data(&extensions);
        sVar17 = CBB_len(&extensions);
        iVar7 = CBB_add_bytes(&extensions_1,puVar14,sVar17);
        if ((((iVar7 != 0) && (iVar7 = CBB_add_u16(&extensions_encoded,0xfd00), iVar7 != 0)) &&
            (iVar7 = CBB_add_u16_length_prefixed(&extensions_encoded,&extension), iVar7 != 0)) &&
           (iVar7 = CBB_add_u8_length_prefixed(&extension,&local_90), iVar7 != 0)) {
          puVar14 = CBB_data(&outer_extensions.ctx_);
          sVar17 = CBB_len(&outer_extensions.ctx_);
          iVar7 = CBB_add_bytes(&local_90,puVar14,sVar17);
          if ((iVar7 != 0) && (iVar7 = CBB_flush(&extensions_encoded), iVar7 != 0))
          goto LAB_00136847;
        }
      }
    }
  }
  else {
    uVar6 = ssl_get_grease_value(hs,ssl_grease_extension1);
    bVar3 = add_padding_extension(&extensions,uVar6,0);
    if ((bVar3) && (iVar7 = CBB_add_u16(&outer_extensions.ctx_,uVar6), iVar7 != 0))
    goto LAB_0013633a;
  }
LAB_001368c3:
  bVar3 = false;
LAB_00136569:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            (&outer_extensions);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&extensions);
  return bVar3;
}

Assistant:

bool ssl_add_clienthello_tlsext(SSL_HANDSHAKE *hs, CBB *out, CBB *out_encoded,
                                bool *out_needs_psk_binder,
                                ssl_client_hello_type_t type,
                                size_t header_len) {
  *out_needs_psk_binder = false;

  if (type == ssl_client_hello_inner) {
    return ssl_add_clienthello_tlsext_inner(hs, out, out_encoded,
                                            out_needs_psk_binder);
  }

  assert(out_encoded == nullptr);  // Only ClientHelloInner needs two outputs.
  SSL *const ssl = hs->ssl;
  CBB extensions;
  if (!CBB_add_u16_length_prefixed(out, &extensions)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // Note we may send multiple ClientHellos for DTLS HelloVerifyRequest and TLS
  // 1.3 HelloRetryRequest. For the latter, the extensions may change, so it is
  // important to reset this value.
  hs->extensions.sent = 0;

  // Add a fake empty extension. See RFC 8701.
  if (ssl->ctx->grease_enabled &&
      !add_padding_extension(
          &extensions, ssl_get_grease_value(hs, ssl_grease_extension1), 0)) {
    return false;
  }

  bool last_was_empty = false;
  for (size_t unpermuted = 0; unpermuted < kNumExtensions; unpermuted++) {
    size_t i = hs->extension_permutation.empty()
                   ? unpermuted
                   : hs->extension_permutation[unpermuted];
    const size_t len_before = CBB_len(&extensions);
    if (!kExtensions[i].add_clienthello(hs, &extensions, &extensions, type)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_ADDING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
      return false;
    }

    const size_t bytes_written = CBB_len(&extensions) - len_before;
    if (bytes_written != 0) {
      hs->extensions.sent |= (1u << i);
    }
    // If the difference in lengths is only four bytes then the extension had
    // an empty body.
    last_was_empty = (bytes_written == 4);
  }

  if (ssl->ctx->grease_enabled) {
    // Add a fake non-empty extension. See RFC 8701.
    if (!add_padding_extension(
            &extensions, ssl_get_grease_value(hs, ssl_grease_extension2), 1)) {
      return false;
    }
    last_was_empty = false;
  }

  // In cleartext ClientHellos, we add the padding extension to work around
  // bugs. We also apply this padding to ClientHelloOuter, to keep the wire
  // images aligned.
  size_t psk_extension_len = ext_pre_shared_key_clienthello_length(hs, type);
  if (!SSL_is_dtls(ssl) && !SSL_is_quic(ssl) &&
      !ssl->s3->used_hello_retry_request) {
    header_len +=
        SSL3_HM_HEADER_LENGTH + 2 + CBB_len(&extensions) + psk_extension_len;
    size_t padding_len = 0;

    // The final extension must be non-empty. WebSphere Application
    // Server 7.0 is intolerant to the last extension being zero-length. See
    // https://crbug.com/363583.
    if (last_was_empty && psk_extension_len == 0) {
      padding_len = 1;
      // The addition of the padding extension may push us into the F5 bug.
      header_len += 4 + padding_len;
    }

    // Add padding to workaround bugs in F5 terminators. See RFC 7685.
    //
    // NB: because this code works out the length of all existing extensions
    // it MUST always appear last (save for any PSK extension).
    if (header_len > 0xff && header_len < 0x200) {
      // If our calculations already included a padding extension, remove that
      // factor because we're about to change its length.
      if (padding_len != 0) {
        header_len -= 4 + padding_len;
      }
      padding_len = 0x200 - header_len;
      // Extensions take at least four bytes to encode. Always include at least
      // one byte of data if including the extension. WebSphere Application
      // Server 7.0 is intolerant to the last extension being zero-length. See
      // https://crbug.com/363583.
      if (padding_len >= 4 + 1) {
        padding_len -= 4;
      } else {
        padding_len = 1;
      }
    }

    if (padding_len != 0 &&
        !add_padding_extension(&extensions, TLSEXT_TYPE_padding, padding_len)) {
      return false;
    }
  }

  // The PSK extension must be last, including after the padding.
  const size_t len_before = CBB_len(&extensions);
  if (!ext_pre_shared_key_add_clienthello(hs, &extensions, out_needs_psk_binder,
                                          type)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  assert(psk_extension_len == CBB_len(&extensions) - len_before);
  (void)len_before;  // |assert| is omitted in release builds.

  // Discard empty extensions blocks.
  if (CBB_len(&extensions) == 0) {
    CBB_discard_child(out);
  }

  return CBB_flush(out);
}